

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O2

string * __thiscall
websocketpp::transport::asio::socket::socket_category::message_abi_cxx11_
          (string *__return_storage_ptr__,socket_category *this,int value)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_12;
  allocator local_11;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(value) {
  case 1:
    pcVar2 = "Security policy error";
    paVar1 = &local_9;
    break;
  case 2:
    pcVar2 = "Socket component error";
    paVar1 = &local_a;
    break;
  case 3:
    pcVar2 = "Invalid state";
    paVar1 = &local_b;
    break;
  case 4:
    pcVar2 = "Invalid or empty TLS context supplied";
    paVar1 = &local_c;
    break;
  case 5:
    pcVar2 = "TLS handshake timed out";
    paVar1 = &local_d;
    break;
  case 6:
    pcVar2 = "Pass through from socket policy";
    paVar1 = &local_e;
    break;
  case 7:
    pcVar2 = "Required tls_init handler not present.";
    paVar1 = &local_f;
    break;
  case 8:
    pcVar2 = "TLS handshake failed";
    paVar1 = &local_10;
    break;
  case 9:
    pcVar2 = "Failed to set TLS SNI hostname";
    paVar1 = &local_11;
    break;
  default:
    pcVar2 = "Unknown";
    paVar1 = &local_12;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int value) const {
        switch(value) {
            case error::security:
                return "Security policy error";
            case error::socket:
                return "Socket component error";
            case error::invalid_state:
                return "Invalid state";
            case error::invalid_tls_context:
                return "Invalid or empty TLS context supplied";
            case error::tls_handshake_timeout:
                return "TLS handshake timed out";
            case error::pass_through:
                return "Pass through from socket policy";
            case error::missing_tls_init_handler:
                return "Required tls_init handler not present.";
            case error::tls_handshake_failed:
                return "TLS handshake failed";
            case error::tls_failed_sni_hostname:
                return "Failed to set TLS SNI hostname";
            default:
                return "Unknown";
        }
    }